

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::IGXMLScanner::scanEndTag(IGXMLScanner *this,bool *gotData)

{
  ElemStack *this_00;
  XMLBuffer *this_01;
  short sVar1;
  short sVar2;
  uint uVar3;
  XMLSize_t XVar4;
  IdentityConstraintHandler *this_02;
  SchemaElementDecl *elem;
  XMLElementDecl *pXVar5;
  XMLDocumentHandler *pXVar6;
  ValueStackOf<bool> *this_03;
  XMLSize_t XVar7;
  Grammar *pGVar8;
  bool bVar9;
  bool bVar10;
  XMLCh XVar11;
  int iVar12;
  GrammarType GVar13;
  StackElem *pSVar14;
  XMLCh *pXVar15;
  XMLCh *pXVar16;
  ComplexTypeInfo **ppCVar17;
  XMLCh *text2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DatatypeValidator *pDVar18;
  long lVar19;
  RuntimeException *this_04;
  ComplexTypeInfo *pCVar20;
  ReaderMgr *pRVar21;
  uint *puVar22;
  short *psVar23;
  Codes toEmit;
  XMLValidator *pXVar24;
  XMLSize_t failure;
  ulong local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_02;
  
  *gotData = true;
  XVar4 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (XVar4 == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    do {
      XVar11 = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
      if (XVar11 == L'>') break;
    } while (XVar11 != L'\0');
    this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_04,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0x3ac,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    goto LAB_002a71ae;
  }
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    puVar22 = &(this->super_XMLScanner).fElemStack.fStack[XVar4 - 1]->fCurrentURI;
  }
  else {
    puVar22 = &(this->super_XMLScanner).fEmptyNamespaceId;
  }
  this_00 = &(this->super_XMLScanner).fElemStack;
  uVar3 = *puVar22;
  if (this->fGrammarType == SchemaGrammarType) {
    pXVar15 = (this->super_XMLScanner).fElemStack.fStack[XVar4 - 1]->fSchemaElemName;
    pSVar14 = ElemStack::topElement(this_00);
  }
  else {
    pSVar14 = ElemStack::topElement(this_00);
    pXVar15 = QName::getRawName(pSVar14->fThisElement->fElementName);
  }
  pRVar21 = &(this->super_XMLScanner).fReaderMgr;
  bVar9 = XMLReader::skippedStringLong((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar15);
  if (!bVar9) {
    XMLScanner::emitError
              (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
    do {
      XVar11 = ReaderMgr::getNextChar(pRVar21);
      if (XVar11 == L'>') break;
    } while (XVar11 != L'\0');
    ElemStack::popTop(this_00);
    return;
  }
  if (pSVar14->fReaderNum != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
    XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
  }
  ReaderMgr::skipPastSpaces(pRVar21);
  bVar9 = ReaderMgr::skippedChar(pRVar21,L'>');
  if (!bVar9) {
    pXVar16 = QName::getRawName(pSVar14->fThisElement->fElementName);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedEndTag,pXVar16,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (this->fGrammarType == SchemaGrammarType) {
    bVar9 = ValueStackOf<bool>::pop(this->fErrorStack);
    (this->fPSVIElemContext).fErrorOccurred = bVar9;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pSVar14->fThisElement->fCreateReason == Declared)) {
      pRVar21 = (this->super_XMLScanner).fValidator[4].fReaderMgr;
      if (pRVar21->fCurReader == (XMLReader *)0x0) {
        pCVar20 = (ComplexTypeInfo *)0x0;
      }
      else {
        ppCVar17 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                             ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)pRVar21);
        pCVar20 = *ppCVar17;
      }
      (this->fPSVIElemContext).fCurrentTypeInfo = pCVar20;
      if (pCVar20 == (ComplexTypeInfo *)0x0) {
        pDVar18 = (DatatypeValidator *)(this->super_XMLScanner).fValidator[2]._vptr_XMLValidator;
      }
      else {
        pDVar18 = (DatatypeValidator *)0x0;
      }
      (this->fPSVIElemContext).fCurrentDV = pDVar18;
      if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
        pXVar24 = (this->super_XMLScanner).fValidator;
        pRVar21 = pXVar24[3].fReaderMgr;
        *(undefined2 *)
         ((long)&(pRVar21->super_Locator)._vptr_Locator + (long)pXVar24[2].fErrorReporter * 2) = 0;
        (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)pRVar21;
        if (pRVar21 == (ReaderMgr *)&XMLUni::fgZeroLenString) goto LAB_002a6c63;
        psVar23 = &XMLUni::fgZeroLenString;
        if (pRVar21 == (ReaderMgr *)0x0) {
LAB_002a7149:
          if (*psVar23 == 0) goto LAB_002a6c63;
        }
        else {
          do {
            sVar1 = *(short *)&(pRVar21->super_Locator)._vptr_Locator;
            if (sVar1 == 0) goto LAB_002a7149;
            pRVar21 = (ReaderMgr *)((long)&(pRVar21->super_Locator)._vptr_Locator + 2);
            sVar2 = *psVar23;
            psVar23 = psVar23 + 1;
          } while (sVar1 == sVar2);
        }
      }
    }
    else {
      (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
      (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
LAB_002a6c63:
      (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
    }
  }
  if ((this->super_XMLScanner).fValidate == true) {
    if (((this->fGrammarType == DTDGrammarType) && (pSVar14->fCommentOrPISeen == true)) &&
       (*(int *)&pSVar14->fThisElement->field_0x2c == 0)) {
      pXVar24 = (this->super_XMLScanner).fValidator;
      pXVar16 = QName::getRawName(pSVar14->fThisElement->fElementName);
      XMLValidator::emitError
                (pXVar24,EmptyElemHasContent,pXVar16,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (((this->fGrammarType == DTDGrammarType) && (pSVar14->fReferenceEscaped == true)) &&
       (*(int *)&pSVar14->fThisElement->field_0x2c == 3)) {
      pXVar24 = (this->super_XMLScanner).fValidator;
      pXVar16 = QName::getRawName(pSVar14->fThisElement->fElementName);
      XMLValidator::emitError
                (pXVar24,ElemChildrenHasInvalidWS,pXVar16,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar24 = (this->super_XMLScanner).fValidator;
    iVar12 = (*pXVar24->_vptr_XMLValidator[2])(pXVar24,pSVar14->fThisElement,pSVar14->fChildren);
    if ((char)iVar12 == '\0') {
      if (pSVar14->fChildCount == 0) {
        pXVar24 = (this->super_XMLScanner).fValidator;
        iVar12 = (*(pSVar14->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
        pXVar16 = (XMLCh *)CONCAT44(extraout_var_00,iVar12);
        toEmit = EmptyNotValidForContent;
LAB_002a6d91:
        text2 = (XMLCh *)0x0;
      }
      else {
        pXVar24 = (this->super_XMLScanner).fValidator;
        if (pSVar14->fChildCount <= local_38) {
          iVar12 = (*(pSVar14->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
          pXVar16 = (XMLCh *)CONCAT44(extraout_var_01,iVar12);
          toEmit = NotEnoughElemsForCM;
          goto LAB_002a6d91;
        }
        pXVar16 = QName::getRawName(pSVar14->fChildren[local_38]);
        iVar12 = (*(pSVar14->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
        text2 = (XMLCh *)CONCAT44(extraout_var,iVar12);
        toEmit = ElementNotValidForContent;
      }
      XMLValidator::emitError(pXVar24,toEmit,pXVar16,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (this->fGrammarType != SchemaGrammarType) goto LAB_002a6dca;
    if (*(char *)&(this->super_XMLScanner).fValidator[5]._vptr_XMLValidator == '\x01') {
      (this->fPSVIElemContext).fErrorOccurred = true;
LAB_002a6ea9:
      pDVar18 = (DatatypeValidator *)0x0;
    }
    else {
      pDVar18 = (this->fPSVIElemContext).fCurrentDV;
      if ((pDVar18 == (DatatypeValidator *)0x0) || (pDVar18->fType != Union)) goto LAB_002a6ea9;
      iVar12 = (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[0xb])();
      pDVar18 = (DatatypeValidator *)CONCAT44(extraout_var_02,iVar12);
    }
    if (((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) &&
       (bVar9 = *(bool *)((long)&(this->super_XMLScanner).fValidator[5]._vptr_XMLValidator + 1),
       (this->fPSVIElemContext).fIsSpecified = bVar9, bVar9 == true)) {
      (this->fPSVIElemContext).fNormalizedValue = *(XMLCh **)&pSVar14->fThisElement[1].fCreateReason
      ;
    }
    if ((((this->super_XMLScanner).fValidate == true) &&
        ((this->super_XMLScanner).fIdentityConstraintChecking == true)) &&
       (this->fICHandler != (IdentityConstraintHandler *)0x0)) {
      this_02 = this->fICHandler;
      elem = (SchemaElementDecl *)pSVar14->fThisElement;
      pXVar16 = (this->fContent).fBuffer;
      pXVar16[(this->fContent).fIndex] = L'\0';
      IdentityConstraintHandler::deactivateContext
                (this_02,elem,pXVar16,(this->super_XMLScanner).fValidationContext,
                 (this->fPSVIElemContext).fCurrentDV);
    }
  }
  else {
LAB_002a6dca:
    pDVar18 = (DatatypeValidator *)0x0;
  }
  ElemStack::popTop(this_00);
  XVar4 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (this->fGrammarType == SchemaGrammarType) {
    if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
      endElementPSVI(this,(SchemaElementDecl *)pSVar14->fThisElement,pDVar18);
    }
    (this->super_XMLScanner).fValidator[2].fErrorReporter = (XMLErrorReporter *)0x0;
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    if (this->fGrammarType == SchemaGrammarType) {
      iVar12 = pSVar14->fPrefixColonPos;
      this_01 = &(this->super_XMLScanner).fPrefixBuf;
      if ((long)iVar12 == 0xffffffffffffffff) {
        this_01->fIndex = 0;
      }
      else {
        this_01->fIndex = 0;
        XMLBuffer::append(this_01,pXVar15,(long)iVar12);
      }
    }
    else {
      pXVar15 = pSVar14->fThisElement->fElementName->fPrefix;
      (this->super_XMLScanner).fPrefixBuf.fIndex = 0;
      if ((pXVar15 != (XMLCh *)0x0) && (*pXVar15 != L'\0')) {
        XMLBuffer::append(&(this->super_XMLScanner).fPrefixBuf,pXVar15);
      }
    }
    pXVar5 = pSVar14->fThisElement;
    pXVar6 = (this->super_XMLScanner).fDocHandler;
    (this->super_XMLScanner).fPrefixBuf.fBuffer[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
    (*pXVar6->_vptr_XMLDocumentHandler[6])(pXVar6,pXVar5,(ulong)uVar3,(ulong)(XVar4 == 0));
  }
  if ((XVar4 != 0) && (this->fGrammarType == SchemaGrammarType)) {
    this_03 = this->fErrorStack;
    if ((this_03->fVector).fCurCount == 0) {
LAB_002a6f95:
      bVar9 = (this->fPSVIElemContext).fErrorOccurred;
    }
    else {
      bVar10 = ValueStackOf<bool>::pop(this_03);
      bVar9 = true;
      if (!bVar10) goto LAB_002a6f95;
    }
    ValueVectorOf<bool>::ensureExtraCapacity(&this_03->fVector,1);
    XVar7 = (this_03->fVector).fCurCount;
    (this_03->fVector).fCurCount = XVar7 + 1;
    (this_03->fVector).fElemList[XVar7] = bVar9;
  }
  *gotData = XVar4 != 0;
  if (XVar4 == 0) {
    return;
  }
  if ((this->super_XMLScanner).fDoNamespaces != true) goto LAB_002a709a;
  pGVar8 = (this->super_XMLScanner).fElemStack.fStack
           [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fCurrentGrammar;
  (this->super_XMLScanner).fGrammar = pGVar8;
  GVar13 = (*(pGVar8->super_XSerializable)._vptr_XSerializable[5])();
  this->fGrammarType = GVar13;
  if ((GVar13 == SchemaGrammarType) &&
     (iVar12 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xd])(),
     (char)iVar12 == '\0')) {
    lVar19 = 0x418;
    if ((this->super_XMLScanner).fValidatorFromUser == true) {
      this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_04,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                 ,0x4b6,Gen_NoSchemaValidator,(this->super_XMLScanner).fMemoryManager);
LAB_002a71ae:
      __cxa_throw(this_04,&RuntimeException::typeinfo,XMLException::~XMLException);
    }
LAB_002a707b:
    (this->super_XMLScanner).fValidator =
         *(XMLValidator **)
          ((long)&(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler +
          lVar19);
  }
  else if ((this->fGrammarType == DTDGrammarType) &&
          (iVar12 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])(),
          (char)iVar12 == '\0')) {
    lVar19 = 0x410;
    if ((this->super_XMLScanner).fValidatorFromUser == true) {
      this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_04,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                 ,0x4bd,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
      goto LAB_002a71ae;
    }
    goto LAB_002a707b;
  }
  pXVar24 = (this->super_XMLScanner).fValidator;
  (*pXVar24->_vptr_XMLValidator[0xb])(pXVar24,(this->super_XMLScanner).fGrammar);
LAB_002a709a:
  (this->super_XMLScanner).fValidate =
       (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]
       ->fValidationFlag;
  return;
}

Assistant:

void IGXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;

    // these get initialized below
    const ElemStack::StackElem* topElem = 0;
    const XMLCh *elemName = 0;

    // Make sure that its the end of the element that we expect
    // special case for schema validation, whose element decls,
    // obviously don't contain prefix information
    if(fGrammarType == Grammar::SchemaGrammarType)
    {
        elemName = fElemStack.getCurrentSchemaElemName();
        topElem = fElemStack.topElement();
    }
    else
    {
        topElem = fElemStack.topElement();
        elemName = topElem->fThisElement->getFullName();
    }
    if (!fReaderMgr.skippedStringLong(elemName))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , elemName
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        fElemStack.popTop();
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        // reset error occurred
        fPSVIElemContext.fErrorOccurred = fErrorStack->pop();
        if (fValidate && topElem->fThisElement->isDeclared())
        {
            fPSVIElemContext.fCurrentTypeInfo = ((SchemaValidator*) fValidator)->getCurrentTypeInfo();
            if(!fPSVIElemContext.fCurrentTypeInfo)
                fPSVIElemContext.fCurrentDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
            else
                fPSVIElemContext.fCurrentDV = 0;
            if(fPSVIHandler)
            {
                fPSVIElemContext.fNormalizedValue = ((SchemaValidator*) fValidator)->getNormalizedValue();

                if (XMLString::equals(fPSVIElemContext.fNormalizedValue, XMLUni::fgZeroLenString))
                    fPSVIElemContext.fNormalizedValue = 0;
            }
        }
        else
        {
            fPSVIElemContext.fCurrentDV = 0;
            fPSVIElemContext.fCurrentTypeInfo = 0;
            fPSVIElemContext.fNormalizedValue = 0;
        }
    }

    //  If validation is enabled, then lets pass him the list of children and
    //  this element and let him validate it.
    DatatypeValidator* psviMemberType = 0;
    if (fValidate)
    {

       //
       // XML1.0-3rd
       // Validity Constraint:
       // The declaration matches EMPTY and the element has no content (not even
       // entity references, comments, PIs or white space).
       //
       if ( (fGrammarType == Grammar::DTDGrammarType) &&
            (topElem->fCommentOrPISeen)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Empty))
       {
           fValidator->emitError
               (
               XMLValid::EmptyElemHasContent
               , topElem->fThisElement->getFullName()
               );
       }

       //
       // XML1.0-3rd
       // Validity Constraint:
       //
       // The declaration matches children and the sequence of child elements
       // belongs to the language generated by the regular expression in the
       // content model, with optional white space, comments and PIs
       // (i.e. markup matching production [27] Misc) between the start-tag and
       // the first child element, between child elements, or between the last
       // child element and the end-tag.
       //
       // Note that
       //    a CDATA section containing only white space or
       //    a reference to an entity whose replacement text is character references
       //       expanding to white space do not match the nonterminal S, and hence
       //       cannot appear in these positions; however,
       //    a reference to an internal entity with a literal value consisting
       //       of character references expanding to white space does match S,
       //       since its replacement text is the white space resulting from expansion
       //       of the character references.
       //
       if ( (fGrammarType == Grammar::DTDGrammarType)  &&
            (topElem->fReferenceEscaped)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Children))
       {
           fValidator->emitError
               (
               XMLValid::ElemChildrenHasInvalidWS
               , topElem->fThisElement->getFullName()
               );
       }
        XMLSize_t failure;
        bool res = fValidator->checkContent
        (
            topElem->fThisElement
            , topElem->fChildren
            , topElem->fChildCount
            , &failure
        );

        if (!res)
        {
            //  One of the elements is not valid for the content. NOTE that
            //  if no children were provided but the content model requires
            //  them, it comes back with a zero value. But we cannot use that
            //  to index the child array in this case, and have to put out a
            //  special message.
            if (!topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::EmptyNotValidForContent
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else if (failure >= topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::NotEnoughElemsForCM
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , topElem->fChildren[failure]->getRawName()
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
        }


        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (((SchemaValidator*) fValidator)->getErrorOccurred())
                fPSVIElemContext.fErrorOccurred = true;
            else if (fPSVIElemContext.fCurrentDV && fPSVIElemContext.fCurrentDV->getType() == DatatypeValidator::Union)
                psviMemberType = fValidationContext->getValidatingMemberType();

            if (fPSVIHandler)
            {
                fPSVIElemContext.fIsSpecified = ((SchemaValidator*) fValidator)->getIsElemSpecified();
                if(fPSVIElemContext.fIsSpecified)
                    fPSVIElemContext.fNormalizedValue = ((SchemaElementDecl *)topElem->fThisElement)->getDefaultValue();
            }

            // call matchers and de-activate context
            if (toCheckIdentityConstraint())
            {
                fICHandler->deactivateContext
                             (
                              (SchemaElementDecl *) topElem->fThisElement
                            , fContent.getRawBuffer()
                            , fValidationContext
                            , fPSVIElemContext.fCurrentDV
                             );
            }

        }
    }

    // QName dv needed topElem to resolve URIs on the checkContent
    fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        if (fPSVIHandler)
        {
            endElementPSVI(
                (SchemaElementDecl*)topElem->fThisElement, psviMemberType);
        }
        // now we can reset the datatype buffer, since the
        // application has had a chance to copy the characters somewhere else
        ((SchemaValidator *)fValidator)->clearDatatypeBuffer();
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (topElem->fPrefixColonPos != -1)
                fPrefixBuf.set(elemName, topElem->fPrefixColonPos);
            else
                fPrefixBuf.reset();
        }
        else {
            fPrefixBuf.set(topElem->fThisElement->getElementName()->getPrefix());
        }
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , fPrefixBuf.getRawBuffer()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType) {
        if (!isRoot)
        {
            // update error information
            fErrorStack->push((fErrorStack->size() && fErrorStack->pop()) || fPSVIElemContext.fErrorOccurred);


        }
    }

    // If this was the root, then done with content
    gotData = !isRoot;

    if (gotData) {
        if (fDoNamespaces) {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            if (fGrammarType == Grammar::SchemaGrammarType && !fValidator->handlesSchema()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoSchemaValidator, fMemoryManager);
                else {
                    fValidator = fSchemaValidator;
                }
            }
            else if (fGrammarType == Grammar::DTDGrammarType && !fValidator->handlesDTD()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
                else {
                    fValidator = fDTDValidator;
                }
            }

            fValidator->setGrammar(fGrammar);
        }

        // Restore the validation flag
        fValidate = fElemStack.getValidationFlag();
    }
}